

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzip2recover.c
# Opt level: O2

void bsClose(BitStream *bs)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint in_ESI;
  FILE *pFVar4;
  uint uVar5;
  FILE *__stream;
  BitStream *bs_00;
  
  if (bs->mode == 'w') {
    iVar2 = bs->buffLive;
    while (iVar2 < 8) {
      iVar2 = iVar2 + 1;
      bs->buffLive = iVar2;
      bs->buffer = bs->buffer << 1;
    }
    bVar1 = (byte)bs->buffer;
    __stream = (FILE *)(ulong)bVar1;
    pFVar4 = (FILE *)bs->handle;
    iVar2 = putc((uint)bVar1,pFVar4);
    in_ESI = (uint)pFVar4;
    if (iVar2 != -1) {
      bytesOut = bytesOut + 1;
      __stream = (FILE *)bs->handle;
      iVar2 = fflush(__stream);
      if (iVar2 != -1) goto LAB_00101a07;
    }
  }
  else {
LAB_00101a07:
    __stream = (FILE *)bs->handle;
    iVar2 = fclose(__stream);
    if (iVar2 != -1) {
      free(bs);
      return;
    }
    if (bs->mode != 'w') goto LAB_00101a28;
  }
  writeError();
LAB_00101a28:
  readError();
  iVar2 = *(int *)((long)&__stream->_IO_read_ptr + 4);
  if (iVar2 == 8) {
    uVar5 = *(uint *)&__stream->_IO_read_ptr & 0xff;
    bs_00 = (BitStream *)(ulong)uVar5;
    pFVar4 = *(FILE **)__stream;
    iVar2 = putc(uVar5,pFVar4);
    uVar5 = (uint)pFVar4;
    if (iVar2 == -1) {
      writeError();
      for (uVar3 = 7; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
        bsPutBit(bs_00,(uint)((uVar5 >> (uVar3 & 0x1f) & 1) != 0));
      }
      return;
    }
    bytesOut = bytesOut + 1;
    *(undefined4 *)((long)&__stream->_IO_read_ptr + 4) = 1;
    *(uint *)&__stream->_IO_read_ptr = in_ESI & 1;
  }
  else {
    *(uint *)&__stream->_IO_read_ptr = (in_ESI & 1) + *(uint *)&__stream->_IO_read_ptr * 2;
    *(int *)((long)&__stream->_IO_read_ptr + 4) = iVar2 + 1;
  }
  return;
}

Assistant:

static void bsClose ( BitStream* bs )
{
   Int32 retVal;

   if ( bs->mode == 'w' ) {
      while ( bs->buffLive < 8 ) {
         bs->buffLive++;
         bs->buffer <<= 1;
      };
      retVal = putc ( (UChar) (bs->buffer), bs->handle );
      if (retVal == EOF) writeError();
      bytesOut++;
      retVal = fflush ( bs->handle );
      if (retVal == EOF) writeError();
   }
   retVal = fclose ( bs->handle );
   if (retVal == EOF) {
      if (bs->mode == 'w') writeError(); else readError();
   }
   free ( bs );
}